

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolb.c
# Opt level: O1

int ffgclb(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          long elemincre,int nultyp,uchar nulval,uchar *array,char *nularray,int *anynul,int *status
          )

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uchar *values;
  fitsfile *fptr_00;
  long lVar5;
  long nvals;
  double dVar6;
  int iVar7;
  undefined4 uVar8;
  int local_71f8;
  double zero;
  double scale;
  LONGLONG elemnum;
  int hdutype;
  int tcode;
  long local_71c8;
  LONGLONG tnull;
  uint local_71b8;
  undefined4 local_71b4;
  fitsfile *local_71b0;
  long incre;
  int maxelem2;
  long local_7198;
  LONGLONG repeat;
  long twidth;
  double local_7180;
  long local_7178;
  LONGLONG rowlen;
  LONGLONG startpos;
  int decimals;
  int xcode;
  char snull [20];
  char tform [20];
  long xwidth;
  char message [81];
  double cbuff [3600];
  
  iVar7 = *status;
  if (nelem != 0 && iVar7 < 1) {
    if (anynul != (int *)0x0) {
      *anynul = 0;
    }
    local_71c8 = elemincre;
    local_71b0 = fptr;
    if (nultyp == 2) {
      memset(nularray,0,nelem);
    }
    fptr_00 = local_71b0;
    ffgcprll(local_71b0,colnum,firstrow,firstelem,nelem,(int)(local_71c8 >> 0x3f) + 0x10,&scale,
             &zero,tform,&twidth,&tcode,&maxelem2,&startpos,&elemnum,&incre,&repeat,&rowlen,&hdutype
             ,&tnull,snull,status);
    if (local_71c8 == 1 && tcode == 0xe) {
      ffgcll(fptr_00,colnum,firstrow,firstelem,nelem,nultyp,nulval,(char *)array,nularray,anynul,
             status);
    }
    else {
      if (0 < *status) {
        return *status;
      }
      local_7198 = (long)maxelem2;
      incre = incre * local_71c8;
      local_7180 = 1.0;
      local_71b8 = colnum;
      if ((tcode == 0x10) && (local_7180 = 1.0, hdutype == 1)) {
        ffasfm(tform,&xcode,&xwidth,&decimals,status);
        local_7180 = 1.0;
        lVar2 = (long)decimals;
        fptr_00 = local_71b0;
        if (0 < lVar2) {
          local_7180 = 1.0;
          do {
            local_7180 = local_7180 * 10.0;
            lVar2 = lVar2 + -1;
          } while (lVar2 != 0);
        }
      }
      local_71f8 = 0;
      if (nultyp != 1 || nulval != '\0') {
        uVar1 = CONCAT44(tnull._4_4_,CONCAT22(tnull._2_2_,CONCAT11(tnull._1_1_,(uchar)tnull)));
        if (((tcode % 10 != 1 || uVar1 != 0x4995cdd1) &&
            (tcode != 0x15 || (long)CONCAT11(tnull._1_1_,(uchar)tnull) == uVar1)) &&
           (tcode != 0xb || uVar1 < 0x100)) {
          local_71f8 = 0;
          if (snull[0] != '\x01') {
            local_71f8 = nultyp;
          }
          if (tcode != 0x10) {
            local_71f8 = nultyp;
          }
        }
      }
      if (tcode == 0xb) {
        local_7198 = 0x7fffffff;
        if (nelem < 0x7fffffff) {
          local_7198 = nelem;
        }
        iVar7 = -(uint)(zero == 0.0 && scale == 1.0);
        local_71b4 = CONCAT31((int3)((uint)iVar7 >> 8),(byte)iVar7 & local_71f8 == 0);
      }
      else {
        local_71b4 = 0;
      }
      if (nelem != 0) {
        local_7178 = -local_71c8;
        lVar2 = 0;
        lVar5 = 0;
        do {
          lVar4 = local_7198;
          if (nelem < local_7198) {
            lVar4 = nelem;
          }
          if (local_71c8 < 0) {
            lVar3 = elemnum / local_7178;
          }
          else {
            lVar3 = (~elemnum + repeat) / local_71c8;
          }
          nvals = lVar3 + 1;
          if (lVar4 <= lVar3) {
            nvals = lVar4;
          }
          lVar4 = (incre / local_71c8) * elemnum + rowlen * lVar5 + startpos;
          if (tcode < 0x29) {
            if (tcode == 0xb) {
              values = array + lVar2;
              ffgi1b(fptr_00,lVar4,nvals,incre,values,status);
              if ((char)local_71b4 == '\0') {
                fffi1i1(values,nvals,scale,zero,local_71f8,(uchar)tnull,nulval,nularray + lVar2,
                        anynul,values,status);
              }
            }
            else if (tcode == 0x10) {
              ffmbyt(fptr_00,lVar4,0,status);
              if (incre - twidth == 0) {
                ffgbyt(fptr_00,twidth * nvals,cbuff,status);
              }
              else {
                ffgbytoff(fptr_00,twidth,nvals,incre - twidth,cbuff,status);
              }
              fffstri1((char *)cbuff,nvals,scale,zero,twidth,local_7180,local_71f8,snull,nulval,
                       nularray + lVar2,anynul,array + lVar2,status);
            }
            else {
              if (tcode != 0x15) goto LAB_0014b796;
              ffgi2b(fptr_00,lVar4,nvals,incre,(short *)cbuff,status);
              fffi2i1((short *)cbuff,nvals,scale,zero,local_71f8,CONCAT11(tnull._1_1_,(uchar)tnull),
                      nulval,nularray + lVar2,anynul,array + lVar2,status);
            }
          }
          else if (tcode < 0x51) {
            if (tcode == 0x29) {
              ffgi4b(fptr_00,lVar4,nvals,incre,(int *)cbuff,status);
              fffi4i1((int *)cbuff,nvals,scale,zero,local_71f8,
                      CONCAT22(tnull._2_2_,CONCAT11(tnull._1_1_,(uchar)tnull)),nulval,
                      nularray + lVar2,anynul,array + lVar2,status);
            }
            else {
              if (tcode != 0x2a) {
LAB_0014b796:
                snprintf(message,0x51,"Cannot read bytes from column %d which has format %s",
                         (ulong)local_71b8,tform);
                ffpmsg(message);
                if (hdutype == 1) {
                  *status = 0x137;
                  return 0x137;
                }
                *status = 0x138;
                return 0x138;
              }
              ffgr4b(fptr_00,lVar4,nvals,incre,(float *)cbuff,status);
              fffr4i1((float *)cbuff,nvals,scale,zero,local_71f8,nulval,nularray + lVar2,anynul,
                      array + lVar2,status);
            }
          }
          else if (tcode == 0x51) {
            ffgi8b(fptr_00,lVar4,nvals,incre,(long *)cbuff,status);
            fffi8i1((LONGLONG *)cbuff,nvals,scale,zero,local_71f8,
                    CONCAT44(tnull._4_4_,CONCAT22(tnull._2_2_,CONCAT11(tnull._1_1_,(uchar)tnull))),
                    nulval,nularray + lVar2,anynul,array + lVar2,status);
          }
          else {
            if (tcode != 0x52) goto LAB_0014b796;
            ffgr8b(fptr_00,lVar4,nvals,incre,cbuff,status);
            fffr8i1(cbuff,nvals,scale,zero,local_71f8,nulval,nularray + lVar2,anynul,array + lVar2,
                    status);
          }
          if (0 < *status) {
            dVar6 = (double)lVar2 + 1.0;
            uVar8 = SUB84((double)nvals + (double)lVar2,0);
            if (hdutype < 1) {
              snprintf(message,0x51,"Error reading elements %.0f thru %.0f from image (ffgclb).",
                       dVar6,uVar8);
            }
            else {
              snprintf(message,0x51,"Error reading elements %.0f thru %.0f from column %d (ffgclb)."
                       ,dVar6,uVar8,(ulong)local_71b8);
            }
            ffpmsg(message);
            goto LAB_0014b07a;
          }
          nelem = nelem - nvals;
          if (nelem != 0) {
            lVar2 = lVar2 + nvals;
            elemnum = nvals * local_71c8 + elemnum;
            if (elemnum < repeat) {
              if (elemnum < 0) {
                lVar4 = ~elemnum / repeat + 1;
                lVar5 = lVar5 - lVar4;
                elemnum = lVar4 * repeat + elemnum;
              }
            }
            else {
              lVar4 = elemnum / repeat;
              elemnum = elemnum % repeat;
              lVar5 = lVar5 + lVar4;
            }
          }
          fptr_00 = local_71b0;
        } while (nelem != 0);
      }
      if (*status == -0xb) {
        ffpmsg("Numerical overflow during type conversion while reading FITS data.");
        *status = 0x19c;
      }
    }
LAB_0014b07a:
    iVar7 = *status;
  }
  return iVar7;
}

Assistant:

int ffgclb( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
            LONGLONG firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            long  elemincre,  /* I - pixel increment; e.g., 2 = every other  */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
            unsigned char nulval, /* I - value for null pixels if nultyp = 1 */
            unsigned char *array, /* O - array of values that are read       */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from a column in the current FITS HDU.
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer be a virtual column in a 1 or more grouped FITS primary
  array or image extension.  FITSIO treats a primary array as a binary table
  with 2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.

  The output array of values will be converted from the datatype of the column 
  and will be scaled by the FITS TSCALn and TZEROn values if necessary.
*/
{
    double scale, zero, power = 1., dtemp;
    int tcode, maxelem2, hdutype, xcode, decimals;
    long twidth, incre, ntodo;
    long ii, xwidth;
    int convert, nulcheck, readcheck = 16; /* see note below on readcheck */
    LONGLONG repeat, startpos, elemnum, readptr, tnull;
    LONGLONG rowlen, rownum, remain, next, rowincre, maxelem;
    char tform[20];
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value if reading from ASCII table  */

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    void *buffer;

    union u_tag {
       char charval;
       unsigned char ucharval;
    } u;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    buffer = cbuff;

    if (anynul)
        *anynul = 0;

    if (nultyp == 2)      
       memset(nularray, 0, (size_t) nelem);   /* initialize nullarray */

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (elemincre < 0)
        readcheck -= 1;  /* don't do range checking in this case */

    /* IMPORTANT NOTE: that the special case of using this subroutine
       to read bytes from a character column are handled internally
       by the call to ffgcprll() below.  It will adjust the effective
       *tcode, repeats, etc, to appear as a TBYTE column. */

    /* Note that readcheck = 16 is equivalent to readcheck = 0 
       and readcheck = 15 is equivalent to readcheck = -1, 
       but either of those settings allow TSTRINGS to be 
       treated as TBYTE vectors, but with full error checking */

    ffgcprll( fptr, colnum, firstrow, firstelem, nelem, readcheck, &scale, &zero,
         tform, &twidth, &tcode, &maxelem2, &startpos, &elemnum, &incre,
         &repeat, &rowlen, &hdutype, &tnull, snull, status);
    maxelem = maxelem2;

    /* special case */
    if (tcode == TLOGICAL && elemincre == 1)
    {
        u.ucharval = nulval;
        ffgcll(fptr, colnum, firstrow, firstelem, nelem, nultyp,
               u.charval, (char *) array, nularray, anynul, status);

        return(*status);
    }

    if (*status > 0)
        return(*status);
        
    incre *= elemincre;   /* multiply incre to just get every nth pixel */

    if (tcode == TSTRING && hdutype == ASCII_TBL) /* setup for ASCII tables */
    {
      /* get the number of implied decimal places if no explicit decmal point */
      ffasfm(tform, &xcode, &xwidth, &decimals, status); 
      for(ii = 0; ii < decimals; ii++)
        power *= 10.;
    }
    /*------------------------------------------------------------------*/
    /*  Decide whether to check for null values in the input FITS file: */
    /*------------------------------------------------------------------*/
    nulcheck = nultyp; /* by default, check for null values in the FITS file */

    if (nultyp == 1 && nulval == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    else if (tcode%10 == 1 &&        /* if reading an integer column, and  */ 
            tnull == NULL_UNDEFINED) /* if a null value is not defined,    */
            nulcheck = 0;            /* then do not check for null values. */

    else if (tcode == TSHORT && (tnull > SHRT_MAX || tnull < SHRT_MIN) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TBYTE && (tnull > 255 || tnull < 0) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TSTRING && snull[0] == ASCII_NULL_UNDEFINED)
         nulcheck = 0;

    /*----------------------------------------------------------------------*/
    /*  If FITS column and output data array have same datatype, then we do */
    /*  not need to use a temporary buffer to store intermediate datatype.  */
    /*----------------------------------------------------------------------*/
    convert = 1;
    if (tcode == TBYTE) /* Special Case:                        */
    {                             /* no type convertion required, so read */
                                  /* data directly into output buffer.    */

        if (nelem < (LONGLONG)INT32_MAX) {
            maxelem = nelem;
        } else {
            maxelem = INT32_MAX;
        }

        if (nulcheck == 0 && scale == 1. && zero == 0.)
            convert = 0;  /* no need to scale data or find nulls */
    }

    /*---------------------------------------------------------------------*/
    /*  Now read the pixels from the FITS column. If the column does not   */
    /*  have the same datatype as the output array, then we have to read   */
    /*  the raw values into a temporary buffer (of limited size).  In      */
    /*  the case of a vector colum read only 1 vector of values at a time  */
    /*  then skip to the next row if more values need to be read.          */
    /*  After reading the raw values, then call the fffXXYY routine to (1) */
    /*  test for undefined values, (2) convert the datatype if necessary,  */
    /*  and (3) scale the values by the FITS TSCALn and TZEROn linear      */
    /*  scaling parameters.                                                */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to read */
    next = 0;                 /* next element in array to be read   */
    rownum = 0;               /* row number, relative to firstrow   */

    while (remain)
    {
        /* limit the number of pixels to read at one time to the number that
           will fit in the buffer or to the number of pixels that remain in
           the current vector, which ever is smaller.
        */
        ntodo = (long) minvalue(remain, maxelem);
        if (elemincre >= 0)
        {
          ntodo = (long) minvalue(ntodo, ((repeat - elemnum - 1)/elemincre +1));
        }
        else
        {
          ntodo = (long) minvalue(ntodo, (elemnum/(-elemincre) +1));
        }

        readptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * (incre / elemincre));

        switch (tcode) 
        {
            case (TBYTE):
                ffgi1b(fptr, readptr, ntodo, incre, &array[next], status);
                if (convert)
                    fffi1i1(&array[next], ntodo, scale, zero, nulcheck, 
                    (unsigned char) tnull, nulval, &nularray[next], anynul, 
                           &array[next], status);
                break;
            case (TSHORT):
                ffgi2b(fptr, readptr, ntodo, incre, (short *) buffer, status);
                fffi2i1((short  *) buffer, ntodo, scale, zero, nulcheck, 
                       (short) tnull, nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TLONG):
                ffgi4b(fptr, readptr, ntodo, incre, (INT32BIT *) buffer,
                       status);
                fffi4i1((INT32BIT *) buffer, ntodo, scale, zero, nulcheck, 
                       (INT32BIT) tnull, nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TLONGLONG):
                ffgi8b(fptr, readptr, ntodo, incre, (long *) buffer, status);
                fffi8i1( (LONGLONG *) buffer, ntodo, scale, zero, 
                           nulcheck, tnull, nulval, &nularray[next], 
                            anynul, &array[next], status);
                break;
            case (TFLOAT):
                ffgr4b(fptr, readptr, ntodo, incre, (float  *) buffer, status);
                fffr4i1((float  *) buffer, ntodo, scale, zero, nulcheck, 
                       nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TDOUBLE):
                ffgr8b(fptr, readptr, ntodo, incre, (double *) buffer, status);
                fffr8i1((double *) buffer, ntodo, scale, zero, nulcheck, 
                          nulval, &nularray[next], anynul, 
                          &array[next], status);
                break;
            case (TSTRING):
                ffmbyt(fptr, readptr, REPORT_EOF, status);
       
                if (incre == twidth)    /* contiguous bytes */
                     ffgbyt(fptr, ntodo * twidth, buffer, status);
                else
                     ffgbytoff(fptr, twidth, ntodo, incre - twidth, buffer,
                               status);

                /* interpret the string as an ASCII formated number */
                fffstri1((char *) buffer, ntodo, scale, zero, twidth, power,
                      nulcheck, snull, nulval, &nularray[next], anynul,
                      &array[next], status);
                break;

            default:  /*  error trap for invalid column format */
                snprintf(message, FLEN_ERRMSG,
                   "Cannot read bytes from column %d which has format %s",
                    colnum, tform);
                ffpmsg(message);
                if (hdutype == ASCII_TBL)
                    return(*status = BAD_ATABLE_FORMAT);
                else
                    return(*status = BAD_BTABLE_FORMAT);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous read operation */
        {
	  dtemp = (double) next;
          if (hdutype > 0)
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from column %d (ffgclb).",
              dtemp+1., dtemp+ntodo, colnum);
          else
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from image (ffgclb).",
              dtemp+1., dtemp+ntodo);

         ffpmsg(message);
         return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum = elemnum + (ntodo * elemincre);

            if (elemnum >= repeat)  /* completed a row; start on later row */
            {
                rowincre = elemnum / repeat;
                rownum += rowincre;
                elemnum = elemnum - (rowincre * repeat);
            }
            else if (elemnum < 0)  /* completed a row; start on a previous row */
            {
                rowincre = (-elemnum - 1) / repeat + 1;
                rownum -= rowincre;
                elemnum = (rowincre * repeat) + elemnum;
            }
        }
    }  /*  End of main while Loop  */


    /*--------------------------------*/
    /*  check for numerical overflow  */
    /*--------------------------------*/
    if (*status == OVERFLOW_ERR)
    {
        ffpmsg(
        "Numerical overflow during type conversion while reading FITS data.");
        *status = NUM_OVERFLOW;
    }

    return(*status);
}